

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

void __thiscall
slang::ast::DistVarVisitor::visit<slang::ast::HierarchicalValueExpression>
          (DistVarVisitor *this,HierarchicalValueExpression *expr)

{
  SourceRange sourceRange;
  RandMode RVar1;
  SourceLocation SVar2;
  int *in_RSI;
  long in_RDI;
  bool unaff_retaddr;
  Expression *in_stack_00000008;
  Symbol *in_stack_00000010;
  ASTContext *in_stack_00000018;
  RandMode mode;
  Symbol *sym;
  
  if (((*in_RSI - 8U < 2) || (*in_RSI - 0x12U < 3)) &&
     (SVar2 = (SourceLocation)Expression::getSymbolReference(in_stack_00000008,unaff_retaddr),
     SVar2 != (SourceLocation)0x0)) {
    RVar1 = ASTContext::getRandMode(in_stack_00000018,in_stack_00000010);
    if (RVar1 == Rand) {
      *(undefined1 *)(in_RDI + 8) = 1;
    }
    else if (RVar1 == RandC) {
      sourceRange.endLoc = SVar2;
      sourceRange.startLoc = (SourceLocation)0x200380008;
      ASTContext::addDiag(*(ASTContext **)(in_RSI + 10),SUB84((ulong)in_RSI >> 0x20,0),sourceRange);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        RandMode mode = context.getRandMode(*sym);
                        if (mode == RandMode::Rand)
                            anyRandVars = true;
                        else if (mode == RandMode::RandC)
                            context.addDiag(diag::RandCInDist, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, DistVarVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }